

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void * __thiscall google::protobuf::DescriptorPool::Tables::AllocateBytes(Tables *this,int size)

{
  Tables *local_28;
  void *result;
  Tables *pTStack_18;
  int size_local;
  Tables *this_local;
  
  if (size == 0) {
    this_local = (Tables *)0x0;
  }
  else {
    result._4_4_ = size;
    pTStack_18 = this;
    local_28 = (Tables *)operator_new((long)size);
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->allocations_,&local_28);
    this_local = local_28;
  }
  return this_local;
}

Assistant:

void* DescriptorPool::Tables::AllocateBytes(int size) {
  // TODO(kenton):  Would it be worthwhile to implement this in some more
  // sophisticated way?  Probably not for the open source release, but for
  // internal use we could easily plug in one of our existing memory pool
  // allocators...
  if (size == 0) return NULL;

  void* result = operator new(size);
  allocations_.push_back(result);
  return result;
}